

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_help.cpp
# Opt level: O0

void __thiscall
ktx::OptionsHelp::process(OptionsHelp *this,Options *param_2,ParseResult *args,Reporter *report)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  key_type *in_stack_fffffffffffffcf8;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  hasher *in_stack_fffffffffffffd10;
  size_type in_stack_fffffffffffffd18;
  string *in_stack_fffffffffffffd20;
  ParseResult *in_stack_fffffffffffffd28;
  ParseResult *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  OptionValue *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  key_type *in_stack_fffffffffffffd70;
  Reporter *in_stack_fffffffffffffd78;
  undefined1 local_1e1 [33];
  string local_1c0 [32];
  string local_1a0 [36];
  undefined1 local_17c [5];
  allocator<char> local_177;
  allocator<char> local_176;
  allocator<char> local_175;
  allocator<char> local_174;
  allocator<char> local_173;
  allocator<char> local_172;
  allocator<char> local_171;
  Reporter *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  allocator<char> local_41;
  string local_40 [64];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             (allocator<char> *)in_stack_fffffffffffffd30);
  sVar2 = cxxopts::ParseResult::count(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  if (sVar2 != 0) {
    if ((process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::command_table_abi_cxx11_
         == '\0') &&
       (iVar1 = __cxa_guard_acquire(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)
                                     ::command_table_abi_cxx11_), iVar1 != 0)) {
      local_17c[3] = 1;
      local_170 = (Reporter *)&local_168;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (allocator<char> *)in_stack_fffffffffffffd30);
      local_170 = (Reporter *)local_148;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (allocator<char> *)in_stack_fffffffffffffd30);
      local_170 = (Reporter *)local_128;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (allocator<char> *)in_stack_fffffffffffffd30);
      local_170 = (Reporter *)local_108;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (allocator<char> *)in_stack_fffffffffffffd30);
      local_170 = (Reporter *)local_e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (allocator<char> *)in_stack_fffffffffffffd30);
      local_170 = (Reporter *)local_c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (allocator<char> *)in_stack_fffffffffffffd30);
      local_170 = (Reporter *)local_a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (allocator<char> *)in_stack_fffffffffffffd30);
      in_stack_fffffffffffffd78 = (Reporter *)local_88;
      local_170 = in_stack_fffffffffffffd78;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (allocator<char> *)in_stack_fffffffffffffd30);
      local_17c[3] = 0;
      local_68._0_8_ = &local_168;
      local_68._M_string_length = 8;
      in_stack_fffffffffffffcf8 = (key_type *)local_17c;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x29d91d);
      __l._M_len = (size_type)in_stack_fffffffffffffd30;
      __l._M_array = (iterator)in_stack_fffffffffffffd28;
      in_stack_fffffffffffffd70 = in_stack_fffffffffffffcf8;
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffd20,__l,in_stack_fffffffffffffd18,
                      in_stack_fffffffffffffd10,(key_equal *)in_stack_fffffffffffffd08,
                      (allocator_type *)in_stack_fffffffffffffd40);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x29d967);
      in_stack_fffffffffffffd68 = &local_68;
      do {
        in_stack_fffffffffffffd68 = in_stack_fffffffffffffd68 + -1;
        std::__cxx11::string::~string((string *)in_stack_fffffffffffffd68);
      } while (in_stack_fffffffffffffd68 != &local_168);
      std::allocator<char>::~allocator((allocator<char> *)(local_17c + 4));
      std::allocator<char>::~allocator(&local_177);
      std::allocator<char>::~allocator(&local_176);
      std::allocator<char>::~allocator(&local_175);
      std::allocator<char>::~allocator(&local_174);
      std::allocator<char>::~allocator(&local_173);
      std::allocator<char>::~allocator(&local_172);
      std::allocator<char>::~allocator(&local_171);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                    command_table_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                           command_table_abi_cxx11_);
    }
    this_00 = (OptionValue *)local_1e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (allocator<char> *)in_stack_fffffffffffffd30);
    cxxopts::ParseResult::operator[](in_stack_fffffffffffffd30,(string *)in_stack_fffffffffffffd28);
    pbVar3 = cxxopts::OptionValue::as<std::__cxx11::string>(this_00);
    std::__cxx11::string::string(local_1c0,(string *)pbVar3);
    to_lower_copy(in_stack_fffffffffffffd08);
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string((string *)(local_1e1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1e1);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x29db19);
    sVar4 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    if (sVar4 == 0) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x29db4c);
      Reporter::fatal_usage<char_const(&)[33],std::__cxx11::string&>
                (in_stack_fffffffffffffd78,(char (*) [33])in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd68);
    }
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        if (args.count("command")) {
            static const std::unordered_set<std::string> command_table{
                "create",
                "extract",
                "encode",
                "transcode",
                "info",
                "validate",
                "compare",
                "help",
            };

            command = to_lower_copy(args["command"].as<std::string>());
            if (command_table.count(*command) == 0)
                report.fatal_usage("Invalid command specified: \"{}\".", *command);
        }
    }